

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pig.cpp
# Opt level: O0

bool __thiscall Pig::getDecimal(Pig *this,double *result)

{
  bool bVar1;
  char *__nptr;
  double dVar2;
  undefined1 local_40 [8];
  string s;
  double *result_local;
  Pig *this_local;
  
  s.field_2._8_8_ = result;
  std::__cxx11::string::string((string *)local_40);
  bVar1 = getDecimal(this,(string *)local_40);
  if (bVar1) {
    __nptr = (char *)std::__cxx11::string::c_str();
    dVar2 = strtod(__nptr,(char **)0x0);
    *(double *)s.field_2._8_8_ = dVar2;
  }
  std::__cxx11::string::~string((string *)local_40);
  return bVar1;
}

Assistant:

bool Pig::getDecimal (double& result)
{
  std::string s;
  if (getDecimal (s))
  {
    result = std::strtod (s.c_str (), nullptr);
    return true;
  }

  return false;
}